

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O0

Vec_Wec_t * Mpm_ManFindDsdMatches(Mpm_Man_t *p,void *pScl)

{
  int iVar1;
  int iVar2;
  SC_Pin *pSVar3;
  word *pwVar4;
  word local_58;
  word Truth;
  uint local_48;
  int iClass;
  int Config;
  int i;
  SC_Cell *pRepr;
  Vec_Int_t *vClass;
  Vec_Wec_t *vClasses;
  SC_Lib *pLib;
  void *pvStack_18;
  int fVerbose;
  void *pScl_local;
  Mpm_Man_t *p_local;
  
  pLib._4_4_ = p->pPars->fVeryVerbose;
  vClasses = (Vec_Wec_t *)pScl;
  pvStack_18 = pScl;
  pScl_local = p;
  vClass = (Vec_Int_t *)Vec_WecStart(600);
  for (iClass = 0; iVar1 = iClass, iVar2 = Vec_PtrSize((Vec_Ptr_t *)(vClasses + 7)), iVar1 < iVar2;
      iClass = iClass + 1) {
    _Config = (SC_Cell *)Vec_PtrEntry((Vec_Ptr_t *)(vClasses + 7),iClass);
    if ((_Config->n_inputs < 7) && (_Config->n_outputs < 2)) {
      pSVar3 = SC_CellPin(_Config,_Config->n_inputs);
      pwVar4 = Vec_WrdArray(&pSVar3->vFunc);
      local_58 = *pwVar4;
      local_48 = Mpm_CutCheckDsd6((Mpm_Man_t *)pScl_local,local_58);
      if (local_48 == 0xffffffff) {
        if (pLib._4_4_ != 0) {
          printf("Skipping cell %s with non-DSD function\n",_Config->pName);
        }
      }
      else {
        Truth._4_4_ = (int)local_48 >> 0x11;
        local_48 = _Config->Id << 0x11 | local_48 & 0x1ffff;
        pRepr = (SC_Cell *)Vec_WecEntry((Vec_Wec_t *)vClass,Truth._4_4_);
        Vec_IntPush((Vec_Int_t *)pRepr,local_48);
        if (pLib._4_4_ != 0) {
          printf("Gate %5d  %-30s : ",(ulong)(uint)_Config->Id,_Config->pName);
          printf("Class %3d  ",(ulong)Truth._4_4_);
          printf("Area %10.3f  ",(double)_Config->area);
          Extra_PrintBinary(_stdout,&local_48,0x11);
          printf("   ");
          Kit_DsdPrintFromTruth((uint *)&local_58,_Config->n_inputs);
          printf("\n");
        }
      }
    }
    else if (pLib._4_4_ != 0) {
      printf("Skipping cell %s with %d inputs and %d outputs\n",_Config->pName,
             (ulong)(uint)_Config->n_inputs,(ulong)(uint)_Config->n_outputs);
    }
  }
  return (Vec_Wec_t *)vClass;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Finds matches fore each DSD class.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Wec_t * Mpm_ManFindDsdMatches( Mpm_Man_t * p, void * pScl )
{
    int fVerbose = p->pPars->fVeryVerbose;
    SC_Lib * pLib = (SC_Lib *)pScl;
    Vec_Wec_t * vClasses;
    Vec_Int_t * vClass;
    SC_Cell * pRepr;
    int i, Config, iClass;
    word Truth;
    vClasses = Vec_WecStart( 600 );
    SC_LibForEachCellClass( pLib, pRepr, i )
    {
        if ( pRepr->n_inputs > 6 || pRepr->n_outputs > 1 )
        {
            if ( fVerbose )
            printf( "Skipping cell %s with %d inputs and %d outputs\n", pRepr->pName, pRepr->n_inputs, pRepr->n_outputs );
            continue;
        }
        Truth = *Vec_WrdArray( &SC_CellPin(pRepr, pRepr->n_inputs)->vFunc );
        Config = Mpm_CutCheckDsd6( p, Truth );
        if ( Config == -1 )
        {
            if ( fVerbose )
            printf( "Skipping cell %s with non-DSD function\n", pRepr->pName );
            continue;
        }
        iClass = Config >> 17;
        Config = (pRepr->Id << 17) | (Config & 0x1FFFF);
        // write gate and NPN config for this DSD class
        vClass = Vec_WecEntry( vClasses, iClass );
        Vec_IntPush( vClass, Config );
        if ( !fVerbose )
            continue;

        printf( "Gate %5d  %-30s : ", pRepr->Id, pRepr->pName );
        printf( "Class %3d  ", iClass );
        printf( "Area %10.3f  ", pRepr->area );
        Extra_PrintBinary( stdout, (unsigned *)&Config, 17 );
        printf( "   " );
        Kit_DsdPrintFromTruth( (unsigned *)&Truth, pRepr->n_inputs ); printf( "\n" );
    }
    return vClasses;
}